

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

void player_kill_monster(monster_conflict *mon,player *p,char *note)

{
  uint32_t *puVar1;
  monster_base *pmVar2;
  player *ppVar3;
  _Bool _Var4;
  uint32_t uVar5;
  monster_lore *lore;
  monster_base *pmVar6;
  size_t sVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  short sVar12;
  wchar_t wVar13;
  uint type;
  int iVar14;
  char *fmt;
  int iVar15;
  char m_name [80];
  char buf [80];
  char unique_name [80];
  
  lore = get_lore(mon->race);
  wVar13 = (uint)(note != (char *)0x0) << 9;
  monster_desc(m_name,0x50,(monster *)mon,wVar13);
  if (mon->original_race != (monster_race *)0x0) {
    monster_revert_shape(mon);
    lore = get_lore(mon->race);
    monster_desc(m_name,0x50,(monster *)mon,wVar13);
  }
  _Var4 = monster_is_unique((monster *)mon);
  if (_Var4) {
    pmVar2 = mon->race->base;
    pmVar6 = lookup_monster_base("Morgoth");
    type = (pmVar2 == pmVar6) + 0x97;
  }
  else {
    type = 6;
  }
  _Var4 = flag_has_dbg((player->state).pflags,10,0x45,"player->state.pflags","(PF_SOUL_SIPHON)");
  if ((_Var4) && (player->csp < player->msp)) {
    _Var4 = monster_is_living((monster *)mon);
    if (_Var4) {
      _Var4 = monster_is_stupid((monster *)mon);
      if (!_Var4) {
        _Var4 = flag_has_dbg(mon->race->flags,0xc,0x46,"mon->race->flags","RF_DEMON");
        if (!_Var4) {
          iVar15 = (int)(short)(mon->maxhp / 0x1e + 2);
          msg("You gain mana.");
          iVar9 = player->csp + iVar15;
          sVar12 = player->msp;
          iVar14 = (int)sVar12;
          if ((int)player->lev < iVar9 - iVar14) {
            msg("You absorb too much mana!");
            ppVar3 = player;
            wVar13 = damroll(2,8);
            take_hit(ppVar3,wVar13,"mana burn");
            sVar12 = player->msp;
            iVar9 = player->csp + iVar15;
            iVar14 = (int)sVar12;
          }
          ppVar3 = player;
          if (iVar9 <= iVar14) {
            sVar12 = (short)iVar9;
          }
          player->csp = sVar12;
          puVar1 = &ppVar3->upkeep->redraw;
          *puVar1 = *puVar1 | 0x80;
        }
      }
    }
  }
  if (note == (char *)0x0) {
    notice_stuff(p);
    _Var4 = monster_is_visible((monster *)mon);
    if (_Var4) {
      _Var4 = monster_is_destroyed((monster *)mon);
      if (_Var4) {
        fmt = "You have destroyed %s.";
      }
      else {
        fmt = "You have slain %s.";
      }
    }
    else {
      fmt = "You have killed %s.";
    }
    msgt(type,fmt,m_name);
  }
  else {
    sVar7 = strlen(note);
    if (1 < sVar7) {
      notice_stuff(p);
      my_strcap(m_name);
      msgt(type,"%s%s",m_name,note);
    }
  }
  lVar10 = (long)p->lev;
  lVar8 = (long)mon->race->level * (long)mon->race->mexp;
  lVar11 = (ulong)p->exp_frac + (lVar8 % lVar10 << 0x10) / lVar10;
  p->exp_frac = (uint16_t)lVar11;
  _Var4 = monster_is_unique((monster *)mon);
  if (_Var4) {
    if (mon->original_race != (monster_race *)0x0) {
      __assert_fail("mon->original_race == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-util.c"
                    ,0x478,
                    "void player_kill_monster(struct monster *, struct player *, const char *)");
    }
    mon->race->max_num = '\0';
    monster_desc(unique_name,0x50,(monster *)mon,L'\x88');
    strnfmt(buf,0x50,"Killed %s",unique_name);
    history_add(p,buf,L'\x06');
  }
  _Var4 = flag_has_dbg(mon->race->flags,0xc,2,"mon->race->flags","RF_PLAYER_GHOST");
  if (_Var4) {
    uVar5 = Rand_div(3);
    if (uVar5 != 0) {
      strnfmt(unique_name,0x400,"%s/bone.%03d");
      _Var4 = file_exists(unique_name);
      if (_Var4) {
        file_delete(unique_name);
      }
    }
  }
  player_exp_gain(p,(uint)(0xffff < (int)lVar11) + (int)(lVar8 / lVar10));
  monster_death(mon,p,false);
  if (p->timed[0x31] != 0) {
    player_inc_timed(p,L'1',L'\n',false,false,true);
    player_over_exert(p,L'\x10',L'\x05',L'\x03');
    player_over_exert(p,L' ',L'\x05',L'\n');
  }
  _Var4 = monster_is_visible((monster *)mon);
  if (!_Var4) {
    _Var4 = monster_is_unique((monster *)mon);
    if (!_Var4) goto LAB_001800aa;
  }
  if (lore->pkills < 0x7fff) {
    lore->pkills = lore->pkills + 1;
  }
  if (lore->tkills < 0x7fff) {
    lore->tkills = lore->tkills + 1;
  }
  lore_update(mon->race,lore);
  monster_race_track(p->upkeep,mon->race);
LAB_001800aa:
  delete_monster_idx((chunk *)cave,mon->midx);
  return;
}

Assistant:

static void player_kill_monster(struct monster *mon, struct player *p,
		const char *note)
{
	int32_t div, new_exp, new_exp_frac;
	struct monster_lore *lore = get_lore(mon->race);
	char m_name[80];
	char buf[80];
	int desc_mode = MDESC_DEFAULT | ((note) ? MDESC_COMMA : 0);

	/* Assume normal death sound */
	int soundfx = MSG_KILL;

	/* Extract monster name */
	monster_desc(m_name, sizeof(m_name), mon, desc_mode);

	/* Shapechanged monsters revert on death */
	if (mon->original_race) {
		monster_revert_shape(mon);
		lore = get_lore(mon->race);
		monster_desc(m_name, sizeof(m_name), mon, desc_mode);
	}

	/* Play a special sound if the monster was unique */
	if (monster_is_unique(mon)) {
		if (mon->race->base == lookup_monster_base("Morgoth"))
			soundfx = MSG_KILL_KING;
		else
			soundfx = MSG_KILL_UNIQUE;
	}

	/* Specialty ability Soul Siphon */
	if (player_has(player, PF_SOUL_SIPHON) && (player->csp < player->msp) &&
		monster_is_living(mon) && !monster_is_stupid(mon) &&
		!rf_has(mon->race->flags, RF_DEMON)) {
		int gain = 2 + (mon->maxhp / 30);
		msg("You gain mana.");

		/* If there is a lot of excess mana, it can do damage */
		if (player->csp + gain - player->msp > player->lev) {
			msg("You absorb too much mana!");
			take_hit(player, damroll(2, 8), "mana burn");
		}
		player->csp = MIN(player->csp + gain, player->msp);
		player->upkeep->redraw |= PR_MANA;
	}

	/* Death message */
	if (note) {
		if (strlen(note) <= 1) {
			/* Death by Spell attack - messages handled by project_m() */
		} else {
			/* Make sure to flush any monster messages first */
			notice_stuff(p);

			/* Death by Missile attack */
			my_strcap(m_name);
			msgt(soundfx, "%s%s", m_name, note);
		}
	} else {
		/* Make sure to flush any monster messages first */
		notice_stuff(p);

		if (!monster_is_visible(mon))
			/* Death by physical attack -- invisible monster */
			msgt(soundfx, "You have killed %s.", m_name);
		else if (monster_is_destroyed(mon))
			/* Death by Physical attack -- non-living monster */
			msgt(soundfx, "You have destroyed %s.", m_name);
		else
			/* Death by Physical attack -- living monster */
			msgt(soundfx, "You have slain %s.", m_name);
	}

	/* Player level */
	div = p->lev;

	/* Give some experience for the kill */
	new_exp = ((long)mon->race->mexp * mon->race->level) / div;

	/* Handle fractional experience */
	new_exp_frac = ((((long)mon->race->mexp * mon->race->level) % div)
					* 0x10000L / div) + p->exp_frac;

	/* Keep track of experience */
	if (new_exp_frac >= 0x10000L) {
		new_exp++;
		p->exp_frac = (uint16_t)(new_exp_frac - 0x10000L);
	} else {
		p->exp_frac = (uint16_t)new_exp_frac;
	}

	/* When the player kills a Unique, it stays dead */
	if (monster_is_unique(mon)) {
		char unique_name[80];
		assert(mon->original_race == NULL);
		mon->race->max_num = 0;

		/* This gets the correct name if we slay an invisible
		 * unique and don't have See Invisible. */
		monster_desc(unique_name, sizeof(unique_name), mon,
					 MDESC_DIED_FROM);

		/* Log the slaying of a unique */
		strnfmt(buf, sizeof(buf), "Killed %s", unique_name);
		history_add(p, buf, HIST_SLAY_UNIQUE);
	}

	/* When the player kills a player ghost, the bones file that it used
	 * is (often) deleted. */
	if (rf_has(mon->race->flags, RF_PLAYER_GHOST)) {
		if (!one_in_(3)) {
			char path[1024];
			strnfmt(path, sizeof(path), "%s/bone.%03d", ANGBAND_DIR_BONE,
					cave->ghost->bones_selector);
			if (file_exists(path)) file_delete(path);
		}
	}

	/* Gain experience */
	player_exp_gain(p, new_exp);

	/* Generate treasure */
	monster_death(mon, p, false);

	/* Bloodlust bonus */
	if (p->timed[TMD_BLOODLUST]) {
		player_inc_timed(p, TMD_BLOODLUST, 10, false, false, true);
		player_over_exert(p, PY_EXERT_CONF, 5, 3);
		player_over_exert(p, PY_EXERT_HALLU, 5, 10);
	}

	/* Recall even invisible uniques or winners */
	if (monster_is_visible(mon) || monster_is_unique(mon)) {
		/* Count kills this life */
		if (lore->pkills < SHRT_MAX) lore->pkills++;

		/* Count kills in all lives */
		if (lore->tkills < SHRT_MAX) lore->tkills++;

		/* Update lore and tracking */
		lore_update(mon->race, lore);
		monster_race_track(p->upkeep, mon->race);
	}

	/* Delete the monster */
	delete_monster_idx(cave, mon->midx);
}